

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

DescriptorPool * google::protobuf::DescriptorPool::internal_generated_pool(void)

{
  int iVar1;
  DescriptorPool *in_stack_ffffffffffffffe0;
  
  if (internal_generated_pool()::generated_pool == '\0') {
    iVar1 = __cxa_guard_acquire(&internal_generated_pool()::generated_pool);
    if (iVar1 != 0) {
      anon_unknown_1::NewGeneratedPool();
      internal_generated_pool::generated_pool =
           internal::OnShutdownDelete<google::protobuf::DescriptorPool>(in_stack_ffffffffffffffe0);
      __cxa_guard_release(&internal_generated_pool()::generated_pool);
    }
  }
  return internal_generated_pool::generated_pool;
}

Assistant:

DescriptorPool* DescriptorPool::internal_generated_pool() {
  static DescriptorPool* generated_pool =
      internal::OnShutdownDelete(NewGeneratedPool());
  return generated_pool;
}